

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O2

ion_err_t ion_find_by_use_master_table
                    (ion_dictionary_config_info_t *config,ion_dict_use_t use_type,char whence)

{
  ion_err_t iVar1;
  undefined3 in_register_00000011;
  uint id;
  ion_dictionary_config_info_t tconfig;
  
  tconfig.id = 0;
  id = 1;
  if (whence == -1) {
    id = ion_master_table_next_id - 1;
  }
  do {
    if (id == 0) {
      return '\x01';
    }
    if (ion_master_table_next_id <= id) {
      return '\x01';
    }
    iVar1 = ion_lookup_in_master_table(id,&tconfig);
    if (iVar1 != '\x01') {
      if (iVar1 != '\0') {
        return iVar1;
      }
      if (tconfig.use_type == use_type) {
        config->value_size = tconfig.value_size;
        config->dictionary_size = tconfig.dictionary_size;
        config->dictionary_type = tconfig.dictionary_type;
        config->dictionary_status = tconfig.dictionary_status;
        *(undefined3 *)&config->field_0x1d = tconfig._29_3_;
        config->id = tconfig.id;
        config->use_type = tconfig.use_type;
        *(int3 *)&config->field_0x5 = tconfig._5_3_;
        config->type = tconfig.type;
        config->key_size = tconfig.key_size;
        return '\0';
      }
    }
    id = id + CONCAT31(in_register_00000011,whence);
  } while( true );
}

Assistant:

ion_err_t
ion_find_by_use_master_table(
	ion_dictionary_config_info_t	*config,
	ion_dict_use_t					use_type,
	char							whence
) {
	ion_dictionary_id_t				id;
	ion_dictionary_config_info_t	tconfig;
	ion_err_t						error;

	tconfig.id	= 0;

	id			= 1;

	if (ION_MASTER_TABLE_FIND_LAST == whence) {
		id = ion_master_table_next_id - 1;
	}

	/* Loop through all items. */
	for (; id < ion_master_table_next_id && id > 0; id += whence) {
		error = ion_lookup_in_master_table(id, &tconfig);

		if (err_item_not_found == error) {
			continue;
		}

		if (err_ok != error) {
			return error;
		}

		/* If this config has the right type, set the output pointer. */
		if (tconfig.use_type == use_type) {
			*config = tconfig;

			return err_ok;
		}
	}

	return err_item_not_found;
}